

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.h
# Opt level: O2

void __thiscall GdlSubstitutionItem::~GdlSubstitutionItem(GdlSubstitutionItem *this)

{
  pointer ppGVar1;
  GdlSlotRefExpression *pGVar2;
  size_t i;
  ulong uVar3;
  
  (this->super_GdlSetAttrItem).super_GdlRuleItem._vptr_GdlRuleItem =
       (_func_int **)&PTR_Clone_00212ad0;
  uVar3 = 0;
  while( true ) {
    ppGVar1 = (this->m_vpexpAssocs).
              super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_vpexpAssocs).
                      super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= uVar3)
    break;
    pGVar2 = ppGVar1[uVar3];
    if (pGVar2 != (GdlSlotRefExpression *)0x0) {
      (**(code **)(*(long *)pGVar2 + 0x10))();
    }
    uVar3 = uVar3 + 1;
  }
  if (this->m_pexpSelector != (GdlSlotRefExpression *)0x0) {
    (**(code **)(*(long *)this->m_pexpSelector + 0x10))();
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_vnAssocs).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>::~_Vector_base
            (&(this->m_vpexpAssocs).
              super__Vector_base<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>);
  GdlSetAttrItem::~GdlSetAttrItem(&this->super_GdlSetAttrItem);
  return;
}

Assistant:

virtual ~GdlSubstitutionItem()
	{
		for (size_t i = 0; i < m_vpexpAssocs.size(); ++i)
			delete m_vpexpAssocs[i];

		if (m_pexpSelector)
			delete m_pexpSelector;
	}